

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueUInt8::read(PLYValueUInt8 *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined1 *puVar1;
  undefined8 in_RAX;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  
  puVar1 = *(undefined1 **)(CONCAT44(in_register_00000034,__fd) + 0x10);
  if (puVar1 < *(undefined1 **)(CONCAT44(in_register_00000034,__fd) + 0x18)) {
    sVar2 = CONCAT71((int7)((ulong)in_RAX >> 8),*puVar1);
    *(undefined1 **)(CONCAT44(in_register_00000034,__fd) + 0x10) = puVar1 + 1;
  }
  else {
    sVar2 = (**(code **)(*(long *)CONCAT44(in_register_00000034,__fd) + 0x50))
                      (CONCAT44(in_register_00000034,__fd));
  }
  this->value = (uchar)sVar2;
  return sVar2;
}

Assistant:

void read(std::streambuf *in) { value=static_cast<unsigned char>(in->sbumpc()); }